

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall
flatbuffers::cpp::CppGenerator::GenKeyFieldMethods(CppGenerator *this,FieldDef *field)

{
  Type *__return_storage_ptr__;
  StructDef *struct_def_00;
  bool bVar1;
  allocator<char> local_869;
  string local_868;
  allocator<char> local_841;
  string local_840;
  allocator<char> local_819;
  string local_818;
  allocator<char> local_7f1;
  string local_7f0;
  string local_7d0;
  undefined1 local_7b0 [8];
  string type;
  string local_788;
  allocator<char> local_761;
  string local_760;
  string local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  allocator<char> local_6f9;
  string local_6f8;
  string local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  allocator<char> local_691;
  string local_690;
  allocator<char> local_669;
  string local_668;
  allocator<char> local_641;
  string local_640;
  string local_620;
  allocator<char> local_5f9;
  string local_5f8;
  StructDef *local_5d8;
  StructDef *struct_def;
  string local_5c8;
  allocator<char> local_5a1;
  string local_5a0;
  allocator<char> local_579;
  string local_578;
  string local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  allocator<char> local_511;
  string local_510;
  string local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  allocator<char> local_4a9;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  allocator<char> local_459;
  string local_458;
  allocator<char> local_431;
  string local_430;
  allocator<char> local_409;
  string local_408;
  allocator<char> local_3e1;
  string local_3e0;
  allocator<char> local_3b9;
  string local_3b8;
  allocator<char> local_391;
  string local_390;
  allocator<char> local_369;
  string local_368;
  allocator<char> local_341;
  string local_340;
  string local_320;
  string local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  undefined1 local_280 [8];
  string input_type;
  StructDef *local_258;
  unsigned_short local_248;
  Type *elem_type;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  byte local_1b;
  byte local_1a;
  byte local_19;
  bool is_struct;
  bool is_array;
  FieldDef *pFStack_18;
  bool is_string;
  FieldDef *field_local;
  CppGenerator *this_local;
  
  pFStack_18 = field;
  field_local = (FieldDef *)this;
  if ((field->key & 1U) == 0) {
    __assert_fail("field.key",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_cpp.cpp"
                  ,0x973,"void flatbuffers::cpp::CppGenerator::GenKeyFieldMethods(const FieldDef &)"
                 );
  }
  local_19 = IsString(&(field->value).type);
  local_1a = IsArray(&(pFStack_18->value).type);
  local_1b = IsStruct(&(pFStack_18->value).type);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "  bool KeyCompareLessThan(const {{STRUCT_NAME}} * const o) const {",&local_41);
  CodeWriter::operator+=(&this->code_,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if ((local_19 & 1) == 0) {
    if (((local_1a & 1) == 0) && ((local_1b & 1) == 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"    return {{FIELD_NAME}}() < o->{{FIELD_NAME}}();",&local_c9)
      ;
      CodeWriter::operator+=(&this->code_,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator(&local_c9);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"    return KeyCompareWithValue(o->{{FIELD_NAME}}()) < 0;",
                 &local_a1);
      CodeWriter::operator+=(&this->code_,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator(&local_a1);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"    return *{{FIELD_NAME}}() < *o->{{FIELD_NAME}}();",&local_79)
    ;
    CodeWriter::operator+=(&this->code_,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"  }",&local_f1);
  CodeWriter::operator+=(&this->code_,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  if ((local_19 & 1) == 0) {
    if ((local_1a & 1) == 0) {
      if ((local_1b & 1) == 0) {
        bVar1 = IsScalar((pFStack_18->value).type.base_type);
        if (!bVar1) {
          __assert_fail("IsScalar(field.value.type.base_type)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_cpp.cpp"
                        ,0x9c6,
                        "void flatbuffers::cpp::CppGenerator::GenKeyFieldMethods(const FieldDef &)")
          ;
        }
        GenTypeBasic_abi_cxx11_((string *)local_7b0,this,&(pFStack_18->value).type,false);
        if (((((this->opts_).super_IDLOptions.scoped_enums & 1U) != 0) &&
            ((pFStack_18->value).type.enum_def != (EnumDef *)0x0)) &&
           (bVar1 = IsScalar((pFStack_18->value).type.base_type), bVar1)) {
          GenTypeGet_abi_cxx11_(&local_7d0,this,&(pFStack_18->value).type," ","const "," *",true);
          std::__cxx11::string::operator=((string *)local_7b0,(string *)&local_7d0);
          std::__cxx11::string::~string((string *)&local_7d0);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7f0,"KEY_TYPE",&local_7f1);
        CodeWriter::SetValue(&this->code_,&local_7f0,(string *)local_7b0);
        std::__cxx11::string::~string((string *)&local_7f0);
        std::allocator<char>::~allocator(&local_7f1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_818,
                   "  int KeyCompareWithValue({{KEY_TYPE}} _{{FIELD_NAME}}) const {",&local_819);
        CodeWriter::operator+=(&this->code_,&local_818);
        std::__cxx11::string::~string((string *)&local_818);
        std::allocator<char>::~allocator(&local_819);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_840,
                   "    return static_cast<int>({{FIELD_NAME}}() > _{{FIELD_NAME}}) - static_cast<int>({{FIELD_NAME}}() < _{{FIELD_NAME}});"
                   ,&local_841);
        CodeWriter::operator+=(&this->code_,&local_840);
        std::__cxx11::string::~string((string *)&local_840);
        std::allocator<char>::~allocator(&local_841);
        std::__cxx11::string::~string((string *)local_7b0);
      }
      else {
        local_5d8 = (pFStack_18->value).type.struct_def;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5f8,"INPUT_TYPE",&local_5f9);
        GenTypeGet_abi_cxx11_(&local_620,this,&(pFStack_18->value).type,"","","",false);
        CodeWriter::SetValue(&this->code_,&local_5f8,&local_620);
        std::__cxx11::string::~string((string *)&local_620);
        std::__cxx11::string::~string((string *)&local_5f8);
        std::allocator<char>::~allocator(&local_5f9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_640,
                   "  int KeyCompareWithValue(const {{INPUT_TYPE}} &_{{FIELD_NAME}}) const {",
                   &local_641);
        CodeWriter::operator+=(&this->code_,&local_640);
        std::__cxx11::string::~string((string *)&local_640);
        std::allocator<char>::~allocator(&local_641);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_668,"    const auto &lhs_{{FIELD_NAME}} = {{FIELD_NAME}}();",
                   &local_669);
        CodeWriter::operator+=(&this->code_,&local_668);
        std::__cxx11::string::~string((string *)&local_668);
        std::allocator<char>::~allocator(&local_669);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_690,"    const auto &rhs_{{FIELD_NAME}} = _{{FIELD_NAME}};",
                   &local_691);
        CodeWriter::operator+=(&this->code_,&local_690);
        std::__cxx11::string::~string((string *)&local_690);
        std::allocator<char>::~allocator(&local_691);
        struct_def_00 = local_5d8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6f8,"FIELD_NAME",&local_6f9);
        CodeWriter::GetValue(&local_6d8,&this->code_,&local_6f8);
        std::operator+(&local_6b8,"lhs_",&local_6d8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_760,"FIELD_NAME",&local_761);
        CodeWriter::GetValue(&local_740,&this->code_,&local_760);
        std::operator+(&local_720,"rhs_",&local_740);
        GenComparatorForStruct(this,struct_def_00,4,&local_6b8,&local_720);
        std::__cxx11::string::~string((string *)&local_720);
        std::__cxx11::string::~string((string *)&local_740);
        std::__cxx11::string::~string((string *)&local_760);
        std::allocator<char>::~allocator(&local_761);
        std::__cxx11::string::~string((string *)&local_6b8);
        std::__cxx11::string::~string((string *)&local_6d8);
        std::__cxx11::string::~string((string *)&local_6f8);
        std::allocator<char>::~allocator(&local_6f9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_788,"    return 0;",
                   (allocator<char> *)(type.field_2._M_local_buf + 0xf));
        CodeWriter::operator+=(&this->code_,&local_788);
        std::__cxx11::string::~string((string *)&local_788);
        std::allocator<char>::~allocator((allocator<char> *)(type.field_2._M_local_buf + 0xf));
      }
    }
    else {
      __return_storage_ptr__ = (Type *)(&input_type.field_2._M_allocated_capacity + 1);
      Type::VectorType(__return_storage_ptr__,&(pFStack_18->value).type);
      GenTypeGet_abi_cxx11_(&local_300,this,__return_storage_ptr__,"","","",false);
      std::operator+(&local_2e0,"::flatbuffers::Array<",&local_300);
      std::operator+(&local_2c0,&local_2e0,", ");
      NumToString<unsigned_short>(&local_320,local_248);
      std::operator+(&local_2a0,&local_2c0,&local_320);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                     &local_2a0,">");
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_320);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_300);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_340,"INPUT_TYPE",&local_341);
      CodeWriter::SetValue(&this->code_,&local_340,(string *)local_280);
      std::__cxx11::string::~string((string *)&local_340);
      std::allocator<char>::~allocator(&local_341);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_368,
                 "  int KeyCompareWithValue(const {{INPUT_TYPE}} *_{{FIELD_NAME}}) const {",
                 &local_369);
      CodeWriter::operator+=(&this->code_,&local_368);
      std::__cxx11::string::~string((string *)&local_368);
      std::allocator<char>::~allocator(&local_369);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_390,
                 "    const {{INPUT_TYPE}} *curr_{{FIELD_NAME}} = {{FIELD_NAME}}();",&local_391);
      CodeWriter::operator+=(&this->code_,&local_390);
      std::__cxx11::string::~string((string *)&local_390);
      std::allocator<char>::~allocator(&local_391);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b8,
                 "    for (::flatbuffers::uoffset_t i = 0; i < curr_{{FIELD_NAME}}->size(); i++) {",
                 &local_3b9);
      CodeWriter::operator+=(&this->code_,&local_3b8);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::allocator<char>::~allocator(&local_3b9);
      bVar1 = IsScalar(input_type.field_2._8_4_);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3e0,"      const auto lhs = curr_{{FIELD_NAME}}->Get(i);",
                   &local_3e1);
        CodeWriter::operator+=(&this->code_,&local_3e0);
        std::__cxx11::string::~string((string *)&local_3e0);
        std::allocator<char>::~allocator(&local_3e1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_408,"      const auto rhs = _{{FIELD_NAME}}->Get(i);",&local_409
                  );
        CodeWriter::operator+=(&this->code_,&local_408);
        std::__cxx11::string::~string((string *)&local_408);
        std::allocator<char>::~allocator(&local_409);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_430,"      if (lhs != rhs)",&local_431);
        CodeWriter::operator+=(&this->code_,&local_430);
        std::__cxx11::string::~string((string *)&local_430);
        std::allocator<char>::~allocator(&local_431);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_458,
                   "        return static_cast<int>(lhs > rhs) - static_cast<int>(lhs < rhs);",
                   &local_459);
        CodeWriter::operator+=(&this->code_,&local_458);
        std::__cxx11::string::~string((string *)&local_458);
        std::allocator<char>::~allocator(&local_459);
      }
      else {
        bVar1 = IsStruct(__return_storage_ptr__);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_480,
                     "      const auto &lhs_{{FIELD_NAME}} = *(curr_{{FIELD_NAME}}->Get(i));",
                     &local_481);
          CodeWriter::operator+=(&this->code_,&local_480);
          std::__cxx11::string::~string((string *)&local_480);
          std::allocator<char>::~allocator(&local_481);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4a8,
                     "      const auto &rhs_{{FIELD_NAME}} = *(_{{FIELD_NAME}}->Get(i));",&local_4a9
                    );
          CodeWriter::operator+=(&this->code_,&local_4a8);
          std::__cxx11::string::~string((string *)&local_4a8);
          std::allocator<char>::~allocator(&local_4a9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_510,"FIELD_NAME",&local_511);
          CodeWriter::GetValue(&local_4f0,&this->code_,&local_510);
          std::operator+(&local_4d0,"lhs_",&local_4f0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_578,"FIELD_NAME",&local_579);
          CodeWriter::GetValue(&local_558,&this->code_,&local_578);
          std::operator+(&local_538,"rhs_",&local_558);
          GenComparatorForStruct(this,local_258,6,&local_4d0,&local_538);
          std::__cxx11::string::~string((string *)&local_538);
          std::__cxx11::string::~string((string *)&local_558);
          std::__cxx11::string::~string((string *)&local_578);
          std::allocator<char>::~allocator(&local_579);
          std::__cxx11::string::~string((string *)&local_4d0);
          std::__cxx11::string::~string((string *)&local_4f0);
          std::__cxx11::string::~string((string *)&local_510);
          std::allocator<char>::~allocator(&local_511);
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a0,"    }",&local_5a1);
      CodeWriter::operator+=(&this->code_,&local_5a0);
      std::__cxx11::string::~string((string *)&local_5a0);
      std::allocator<char>::~allocator(&local_5a1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5c8,"    return 0;",(allocator<char> *)((long)&struct_def + 7));
      CodeWriter::operator+=(&this->code_,&local_5c8);
      std::__cxx11::string::~string((string *)&local_5c8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&struct_def + 7));
      std::__cxx11::string::~string((string *)local_280);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"  int KeyCompareWithValue(const char *_{{FIELD_NAME}}) const {"
               ,&local_119);
    CodeWriter::operator+=(&this->code_,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,"    return strcmp({{FIELD_NAME}}()->c_str(), _{{FIELD_NAME}});"
               ,&local_141);
    CodeWriter::operator+=(&this->code_,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"  }",&local_169);
    CodeWriter::operator+=(&this->code_,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator(&local_169);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,"  template<typename StringType>",&local_191);
    CodeWriter::operator+=(&this->code_,&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator(&local_191);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b8,
               "  int KeyCompareWithValue(const StringType& _{{FIELD_NAME}}) const {",&local_1b9);
    CodeWriter::operator+=(&this->code_,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator(&local_1b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,
               "    if ({{FIELD_NAME}}()->c_str() < _{{FIELD_NAME}}) return -1;",&local_1e1);
    CodeWriter::operator+=(&this->code_,&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"    if (_{{FIELD_NAME}} < {{FIELD_NAME}}()->c_str()) return 1;"
               ,&local_209);
    CodeWriter::operator+=(&this->code_,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"    return 0;",(allocator<char> *)((long)&elem_type + 7));
    CodeWriter::operator+=(&this->code_,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator((allocator<char> *)((long)&elem_type + 7));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_868,"  }",&local_869);
  CodeWriter::operator+=(&this->code_,&local_868);
  std::__cxx11::string::~string((string *)&local_868);
  std::allocator<char>::~allocator(&local_869);
  return;
}

Assistant:

void GenKeyFieldMethods(const FieldDef &field) {
    FLATBUFFERS_ASSERT(field.key);
    const bool is_string = IsString(field.value.type);
    const bool is_array = IsArray(field.value.type);
    const bool is_struct = IsStruct(field.value.type);
    // Generate KeyCompareLessThan function
    code_ +=
        "  bool KeyCompareLessThan(const {{STRUCT_NAME}} * const o) const {";
    if (is_string) {
      // use operator< of ::flatbuffers::String
      code_ += "    return *{{FIELD_NAME}}() < *o->{{FIELD_NAME}}();";
    } else if (is_array || is_struct) {
      code_ += "    return KeyCompareWithValue(o->{{FIELD_NAME}}()) < 0;";
    } else {
      code_ += "    return {{FIELD_NAME}}() < o->{{FIELD_NAME}}();";
    }
    code_ += "  }";

    // Generate KeyCompareWithValue function
    if (is_string) {
      // Compares key against a null-terminated char array.
      code_ += "  int KeyCompareWithValue(const char *_{{FIELD_NAME}}) const {";
      code_ += "    return strcmp({{FIELD_NAME}}()->c_str(), _{{FIELD_NAME}});";
      code_ += "  }";
      // Compares key against any string-like object (e.g. std::string_view or
      // std::string) that implements operator< comparison with const char*.
      code_ += "  template<typename StringType>";
      code_ +=
          "  int KeyCompareWithValue(const StringType& _{{FIELD_NAME}}) const "
          "{";
      code_ +=
          "    if ({{FIELD_NAME}}()->c_str() < _{{FIELD_NAME}}) return -1;";
      code_ += "    if (_{{FIELD_NAME}} < {{FIELD_NAME}}()->c_str()) return 1;";
      code_ += "    return 0;";
    } else if (is_array) {
      const auto &elem_type = field.value.type.VectorType();
      std::string input_type = "::flatbuffers::Array<" +
                               GenTypeGet(elem_type, "", "", "", false) + ", " +
                               NumToString(elem_type.fixed_length) + ">";
      code_.SetValue("INPUT_TYPE", input_type);
      code_ +=
          "  int KeyCompareWithValue(const {{INPUT_TYPE}} *_{{FIELD_NAME}}"
          ") const {";
      code_ +=
          "    const {{INPUT_TYPE}} *curr_{{FIELD_NAME}} = {{FIELD_NAME}}();";
      code_ +=
          "    for (::flatbuffers::uoffset_t i = 0; i < "
          "curr_{{FIELD_NAME}}->size(); i++) {";

      if (IsScalar(elem_type.base_type)) {
        code_ += "      const auto lhs = curr_{{FIELD_NAME}}->Get(i);";
        code_ += "      const auto rhs = _{{FIELD_NAME}}->Get(i);";
        code_ += "      if (lhs != rhs)";
        code_ +=
            "        return static_cast<int>(lhs > rhs)"
            " - static_cast<int>(lhs < rhs);";
      } else if (IsStruct(elem_type)) {
        code_ +=
            "      const auto &lhs_{{FIELD_NAME}} = "
            "*(curr_{{FIELD_NAME}}->Get(i));";
        code_ +=
            "      const auto &rhs_{{FIELD_NAME}} = "
            "*(_{{FIELD_NAME}}->Get(i));";
        GenComparatorForStruct(*elem_type.struct_def, 6,
                               "lhs_" + code_.GetValue("FIELD_NAME"),
                               "rhs_" + code_.GetValue("FIELD_NAME"));
      }
      code_ += "    }";
      code_ += "    return 0;";
    } else if (is_struct) {
      const auto *struct_def = field.value.type.struct_def;
      code_.SetValue("INPUT_TYPE",
                     GenTypeGet(field.value.type, "", "", "", false));
      code_ +=
          "  int KeyCompareWithValue(const {{INPUT_TYPE}} &_{{FIELD_NAME}}) "
          "const {";
      code_ += "    const auto &lhs_{{FIELD_NAME}} = {{FIELD_NAME}}();";
      code_ += "    const auto &rhs_{{FIELD_NAME}} = _{{FIELD_NAME}};";
      GenComparatorForStruct(*struct_def, 4,
                             "lhs_" + code_.GetValue("FIELD_NAME"),
                             "rhs_" + code_.GetValue("FIELD_NAME"));
      code_ += "    return 0;";

    } else {
      FLATBUFFERS_ASSERT(IsScalar(field.value.type.base_type));
      auto type = GenTypeBasic(field.value.type, false);
      if (opts_.scoped_enums && field.value.type.enum_def &&
          IsScalar(field.value.type.base_type)) {
        type = GenTypeGet(field.value.type, " ", "const ", " *", true);
      }
      // Returns {field<val: -1, field==val: 0, field>val: +1}.
      code_.SetValue("KEY_TYPE", type);
      code_ +=
          "  int KeyCompareWithValue({{KEY_TYPE}} _{{FIELD_NAME}}) const {";
      code_ +=
          "    return static_cast<int>({{FIELD_NAME}}() > _{{FIELD_NAME}}) - "
          "static_cast<int>({{FIELD_NAME}}() < _{{FIELD_NAME}});";
    }
    code_ += "  }";
  }